

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

String * __thiscall LiteScript::String::ConvertToUTF8(String *this,u32string *str)

{
  size_type sVar1;
  const_reference pvVar2;
  char cVar3;
  undefined4 local_20;
  uint sz;
  uint i;
  u32string *str_local;
  string *res;
  
  std::__cxx11::string::string((string *)this);
  local_20 = 0;
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size(str);
  for (; local_20 < (uint)sVar1; local_20 = local_20 + 1) {
    pvVar2 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             operator[](str,(ulong)local_20);
    cVar3 = (char)this;
    if ((uint)*pvVar2 < 0x80) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      operator[](str,(ulong)local_20);
      std::__cxx11::string::push_back(cVar3);
    }
    else {
      pvVar2 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               operator[](str,(ulong)local_20);
      if ((uint)*pvVar2 < 0x800) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator[](str,(ulong)local_20);
        std::__cxx11::string::push_back(cVar3);
      }
      else {
        pvVar2 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 operator[](str,(ulong)local_20);
        if ((uint)*pvVar2 < 0x10000) {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator[]
                    (str,(ulong)local_20);
          std::__cxx11::string::push_back(cVar3);
        }
        else {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator[]
                    (str,(ulong)local_20);
          std::__cxx11::string::push_back(cVar3);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator[]
                    (str,(ulong)local_20);
          std::__cxx11::string::push_back(cVar3);
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator[](str,(ulong)local_20);
        std::__cxx11::string::push_back(cVar3);
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      operator[](str,(ulong)local_20);
      std::__cxx11::string::push_back(cVar3);
    }
  }
  return this;
}

Assistant:

std::string LiteScript::String::ConvertToUTF8(const std::u32string& str) {
    std::string res;
    for (unsigned int i = 0, sz = str.size(); i < sz; i++) {
        if (str[i] < 0x80) {
            //1 byte
            res.push_back((unsigned char)(str[i]));
        }
        else {
            if (str[i] < 0x800) {
                //2 bytes
                res.push_back((unsigned char) (0b11000000 | (str[i] >> 6)));
            }
            else {
                if (str[i] < 0x10000) {
                    //3 bytes
                    res.push_back((unsigned char) (0b11100000 | (str[i] >> 12)));
                } else {
                    //4 bytes
                    res.push_back((unsigned char) (0b11110000 | (str[i] >> 18)));
                    res.push_back((unsigned char) (0b10000000 | ((str[i] >> 12) & 0b00111111)));
                }
                res.push_back((unsigned char) (0b10000000 | ((str[i] >> 6) & 0b00111111)));
            }
            res.push_back((unsigned char) (0b10000000 | (str[i] & 0b00111111)));
        }
    }
    return res;
}